

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O0

bool tinyusdz::value::UpcastType(string *reqType,Value *inout)

{
  bool bVar1;
  value_type_conflict3 *pvVar2;
  value_type *pvVar3;
  value_type *pvVar4;
  reference pvVar5;
  reference pvVar6;
  value_type *pvVar7;
  reference pvVar8;
  reference pvVar9;
  value_type *pvVar10;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  reference pvVar15;
  float fVar16;
  array<tinyusdz::value::half,_4UL> local_1a4;
  half4 v_5;
  undefined1 local_192 [8];
  optional<std::array<tinyusdz::value::half,_4UL>_> pv_8;
  double4 dst_7;
  array<tinyusdz::value::half,_3UL> local_15e;
  half3 v_4;
  optional<std::array<tinyusdz::value::half,_3UL>_> local_150;
  optional<std::array<tinyusdz::value::half,_3UL>_> pv_7;
  double3 dst_6;
  array<tinyusdz::value::half,_2UL> local_128;
  undefined1 local_124 [4];
  half2 v_3;
  undefined1 local_118 [2];
  optional<std::array<tinyusdz::value::half,_2UL>_> pv_6;
  double2 dst_5;
  optional<tinyusdz::value::half> local_100;
  optional<tinyusdz::value::half> local_fc;
  double dStack_f8;
  optional<tinyusdz::value::half> pv_5;
  double dst_4;
  array<tinyusdz::value::half,_4UL> local_e4;
  half4 v_2;
  undefined1 local_d2 [8];
  optional<std::array<tinyusdz::value::half,_4UL>_> pv_4;
  float4 dst_3;
  half3 v_1;
  optional<std::array<tinyusdz::value::half,_3UL>_> local_a4;
  optional<std::array<tinyusdz::value::half,_3UL>_> pv_3;
  float3 dst_2;
  half2 v;
  float2 dst_1;
  optional<std::array<tinyusdz::value::half,_2UL>_> local_78;
  uint16_t local_72;
  optional<std::array<tinyusdz::value::half,_2UL>_> pv_2;
  float local_68;
  optional<tinyusdz::value::half> pv_1;
  float dst;
  byte local_39;
  uint local_38;
  bool reqTypeArray;
  optional<unsigned_int> local_2c;
  optional<unsigned_int> pv;
  uint32_t tyid;
  Value *inout_local;
  string *reqType_local;
  
  unique0x10001025 = inout;
  TryGetUnderlyingTypeId((optional<unsigned_int> *)&stack0xffffffffffffffcc,reqType);
  nonstd::optional_lite::optional<unsigned_int>::optional<unsigned_int,_0>
            (&local_2c,(optional<unsigned_int> *)&stack0xffffffffffffffcc);
  nonstd::optional_lite::optional<unsigned_int>::~optional
            ((optional<unsigned_int> *)&stack0xffffffffffffffcc);
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_2c);
  if (bVar1) {
    pvVar2 = nonstd::optional_lite::optional<unsigned_int>::value(&local_2c);
    pv._0_4_ = *pvVar2;
  }
  else {
    reqType_local._7_1_ = 0;
  }
  local_38 = (uint)!bVar1;
  nonstd::optional_lite::optional<unsigned_int>::~optional(&local_2c);
  if (local_38 != 0) goto LAB_003c941e;
  local_39 = 0;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&dst,"[]",(allocator *)((long)&pv_1.contained + 1));
  bVar1 = endsWith(reqType,(string *)&dst);
  ::std::__cxx11::string::~string((string *)&dst);
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&pv_1.contained + 1));
  if (bVar1) {
    local_39 = 1;
  }
  if ((local_39 & 1) == 0) {
    if (pv._0_4_ == 0x28) {
      Value::get_value<tinyusdz::value::half>
                ((optional<tinyusdz::value::half> *)&pv_2,stack0xffffffffffffffe0,false);
      nonstd::optional_lite::optional<tinyusdz::value::half>::optional<tinyusdz::value::half,_0>
                ((optional<tinyusdz::value::half> *)((long)&pv_2.contained + 2),
                 (optional<tinyusdz::value::half> *)&pv_2);
      nonstd::optional_lite::optional<tinyusdz::value::half>::~optional
                ((optional<tinyusdz::value::half> *)&pv_2);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                        ((optional *)((long)&pv_2.contained + 2));
      if (bVar1) {
        pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::half>::value
                           ((optional<tinyusdz::value::half> *)((long)&pv_2.contained + 2));
        local_72 = pvVar3->value;
        local_68 = half_to_float((half)local_72);
        Value::operator=(stack0xffffffffffffffe0,&local_68);
        reqType_local._7_1_ = 1;
      }
      local_38 = (uint)bVar1;
      nonstd::optional_lite::optional<tinyusdz::value::half>::~optional
                ((optional<tinyusdz::value::half> *)((long)&pv_2.contained + 2));
    }
    else if (pv._0_4_ == 0x29) {
      Value::get_value<std::array<tinyusdz::value::half,2ul>>
                ((optional<std::array<tinyusdz::value::half,_2UL>_> *)((long)dst_1._M_elems + 2),
                 stack0xffffffffffffffe0,false);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::
      optional<std::array<tinyusdz::value::half,_2UL>,_0>
                (&local_78,
                 (optional<std::array<tinyusdz::value::half,_2UL>_> *)((long)dst_1._M_elems + 2));
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::~optional
                ((optional<std::array<tinyusdz::value::half,_2UL>_> *)((long)dst_1._M_elems + 2));
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_78);
      if (bVar1) {
        pvVar4 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::value
                           (&local_78);
        dst_2._M_elems[2] = *(float *)pvVar4->_M_elems;
        pvVar5 = ::std::array<tinyusdz::value::half,_2UL>::operator[]
                           ((array<tinyusdz::value::half,_2UL> *)(dst_2._M_elems + 2),0);
        dst_2._M_elems[1]._2_2_ = pvVar5->value;
        fVar16 = half_to_float(dst_2._M_elems[1]._2_2_);
        pvVar6 = ::std::array<float,_2UL>::operator[]
                           ((array<float,_2UL> *)&stack0xffffffffffffff78,0);
        *pvVar6 = fVar16;
        pvVar5 = ::std::array<tinyusdz::value::half,_2UL>::operator[]
                           ((array<tinyusdz::value::half,_2UL> *)(dst_2._M_elems + 2),1);
        dst_2._M_elems[1]._0_2_ = pvVar5->value;
        fVar16 = half_to_float(dst_2._M_elems[1]._0_2_);
        pvVar6 = ::std::array<float,_2UL>::operator[]
                           ((array<float,_2UL> *)&stack0xffffffffffffff78,1);
        *pvVar6 = fVar16;
        Value::operator=(stack0xffffffffffffffe0,(array<float,_2UL> *)&stack0xffffffffffffff78);
        reqType_local._7_1_ = 1;
      }
      local_38 = (uint)bVar1;
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::~optional(&local_78)
      ;
    }
    else if (pv._0_4_ == 0x2a) {
      Value::get_value<std::array<tinyusdz::value::half,3ul>>
                ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&stack0xffffffffffffff54,
                 stack0xffffffffffffffe0,false);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::
      optional<std::array<tinyusdz::value::half,_3UL>,_0>
                (&local_a4,
                 (optional<std::array<tinyusdz::value::half,_3UL>_> *)&stack0xffffffffffffff54);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional
                ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&stack0xffffffffffffff54);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_a4);
      if (bVar1) {
        pvVar7 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                           (&local_a4);
        unique0x00011f80 = *(undefined4 *)pvVar7->_M_elems;
        pvVar8 = ::std::array<tinyusdz::value::half,_3UL>::operator[]
                           ((array<tinyusdz::value::half,_3UL> *)((long)dst_3._M_elems + 0xe),0);
        dst_3._M_elems[3]._0_2_ = pvVar8->value;
        fVar16 = half_to_float(dst_3._M_elems[3]._0_2_);
        pvVar9 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)&pv_3,0);
        *pvVar9 = fVar16;
        pvVar8 = ::std::array<tinyusdz::value::half,_3UL>::operator[]
                           ((array<tinyusdz::value::half,_3UL> *)((long)dst_3._M_elems + 0xe),1);
        dst_3._M_elems[2]._2_2_ = pvVar8->value;
        fVar16 = half_to_float(dst_3._M_elems[2]._2_2_);
        pvVar9 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)&pv_3,1);
        *pvVar9 = fVar16;
        pvVar8 = ::std::array<tinyusdz::value::half,_3UL>::operator[]
                           ((array<tinyusdz::value::half,_3UL> *)((long)dst_3._M_elems + 0xe),2);
        dst_3._M_elems[2]._0_2_ = pvVar8->value;
        fVar16 = half_to_float(dst_3._M_elems[2]._0_2_);
        pvVar9 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)&pv_3,2);
        *pvVar9 = fVar16;
        Value::operator=(stack0xffffffffffffffe0,(array<float,_3UL> *)&pv_3);
        reqType_local._7_1_ = 1;
      }
      local_38 = (uint)bVar1;
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional(&local_a4)
      ;
    }
    else if (pv._0_4_ == 0x2b) {
      Value::get_value<std::array<tinyusdz::value::half,4ul>>
                ((optional<std::array<tinyusdz::value::half,_4UL>_> *)&v_2,stack0xffffffffffffffe0,
                 false);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::
      optional<std::array<tinyusdz::value::half,_4UL>,_0>
                ((optional<std::array<tinyusdz::value::half,_4UL>_> *)local_d2,
                 (optional<std::array<tinyusdz::value::half,_4UL>_> *)&v_2);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::~optional
                ((optional<std::array<tinyusdz::value::half,_4UL>_> *)&v_2);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_d2);
      if (bVar1) {
        pvVar10 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::value
                            ((optional<std::array<tinyusdz::value::half,_4UL>_> *)local_d2);
        local_e4._M_elems = *&pvVar10->_M_elems;
        pvVar11 = ::std::array<tinyusdz::value::half,_4UL>::operator[](&local_e4,0);
        fVar16 = half_to_float((half)pvVar11->value);
        pvVar12 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)&pv_4.contained,0);
        *pvVar12 = fVar16;
        pvVar11 = ::std::array<tinyusdz::value::half,_4UL>::operator[](&local_e4,1);
        fVar16 = half_to_float((half)pvVar11->value);
        pvVar12 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)&pv_4.contained,1);
        *pvVar12 = fVar16;
        pvVar11 = ::std::array<tinyusdz::value::half,_4UL>::operator[](&local_e4,2);
        fVar16 = half_to_float((half)pvVar11->value);
        pvVar12 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)&pv_4.contained,2);
        *pvVar12 = fVar16;
        pvVar11 = ::std::array<tinyusdz::value::half,_4UL>::operator[](&local_e4,3);
        fVar16 = half_to_float((half)pvVar11->value);
        pvVar12 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)&pv_4.contained,3);
        *pvVar12 = fVar16;
        Value::operator=(stack0xffffffffffffffe0,(array<float,_4UL> *)&pv_4.contained);
        reqType_local._7_1_ = 1;
      }
      local_38 = (uint)bVar1;
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::~optional
                ((optional<std::array<tinyusdz::value::half,_4UL>_> *)local_d2);
    }
    else if (pv._0_4_ == 0x2c) {
      Value::get_value<tinyusdz::value::half>(&local_100,stack0xffffffffffffffe0,false);
      nonstd::optional_lite::optional<tinyusdz::value::half>::optional<tinyusdz::value::half,_0>
                (&local_fc,&local_100);
      nonstd::optional_lite::optional<tinyusdz::value::half>::~optional(&local_100);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_fc);
      if (bVar1) {
        pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::half>::value(&local_fc);
        fVar16 = half_to_float((half)pvVar3->value);
        dStack_f8 = (double)fVar16;
        Value::operator=(stack0xffffffffffffffe0,&stack0xffffffffffffff08);
        reqType_local._7_1_ = 1;
      }
      local_38 = (uint)bVar1;
      nonstd::optional_lite::optional<tinyusdz::value::half>::~optional(&local_fc);
    }
    else if (pv._0_4_ == 0x2d) {
      Value::get_value<std::array<tinyusdz::value::half,2ul>>
                ((optional<std::array<tinyusdz::value::half,_2UL>_> *)local_124,
                 stack0xffffffffffffffe0,false);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::
      optional<std::array<tinyusdz::value::half,_2UL>,_0>
                ((optional<std::array<tinyusdz::value::half,_2UL>_> *)(v_3._M_elems + 1),
                 (optional<std::array<tinyusdz::value::half,_2UL>_> *)local_124);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::~optional
                ((optional<std::array<tinyusdz::value::half,_2UL>_> *)local_124);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)(v_3._M_elems + 1))
      ;
      if (bVar1) {
        pvVar4 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::value
                           ((optional<std::array<tinyusdz::value::half,_2UL>_> *)(v_3._M_elems + 1))
        ;
        local_128._M_elems = *&pvVar4->_M_elems;
        pvVar5 = ::std::array<tinyusdz::value::half,_2UL>::operator[](&local_128,0);
        fVar16 = half_to_float((half)pvVar5->value);
        pvVar13 = ::std::array<double,_2UL>::operator[]((array<double,_2UL> *)local_118,0);
        *pvVar13 = (double)fVar16;
        pvVar5 = ::std::array<tinyusdz::value::half,_2UL>::operator[](&local_128,1);
        fVar16 = half_to_float((half)pvVar5->value);
        pvVar13 = ::std::array<double,_2UL>::operator[]((array<double,_2UL> *)local_118,1);
        *pvVar13 = (double)fVar16;
        Value::operator=(stack0xffffffffffffffe0,(array<double,_2UL> *)local_118);
        reqType_local._7_1_ = 1;
      }
      local_38 = (uint)bVar1;
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_2UL>_>::~optional
                ((optional<std::array<tinyusdz::value::half,_2UL>_> *)(v_3._M_elems + 1));
    }
    else if (pv._0_4_ == 0x2e) {
      Value::get_value<std::array<tinyusdz::value::half,3ul>>
                ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&stack0xfffffffffffffea8,
                 stack0xffffffffffffffe0,false);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::
      optional<std::array<tinyusdz::value::half,_3UL>,_0>
                (&local_150,
                 (optional<std::array<tinyusdz::value::half,_3UL>_> *)&stack0xfffffffffffffea8);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional
                ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&stack0xfffffffffffffea8);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_150);
      if (bVar1) {
        pvVar7 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                           (&local_150);
        local_15e._M_elems._0_4_ = *(undefined4 *)pvVar7->_M_elems;
        local_15e._M_elems[2].value = pvVar7->_M_elems[2].value;
        pvVar8 = ::std::array<tinyusdz::value::half,_3UL>::operator[](&local_15e,0);
        fVar16 = half_to_float((half)pvVar8->value);
        pvVar14 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)&pv_7,0);
        *pvVar14 = (double)fVar16;
        pvVar8 = ::std::array<tinyusdz::value::half,_3UL>::operator[](&local_15e,1);
        fVar16 = half_to_float((half)pvVar8->value);
        pvVar14 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)&pv_7,1);
        *pvVar14 = (double)fVar16;
        pvVar8 = ::std::array<tinyusdz::value::half,_3UL>::operator[](&local_15e,2);
        fVar16 = half_to_float((half)pvVar8->value);
        pvVar14 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)&pv_7,2);
        *pvVar14 = (double)fVar16;
        Value::operator=(stack0xffffffffffffffe0,(array<double,_3UL> *)&pv_7);
        reqType_local._7_1_ = 1;
      }
      local_38 = (uint)bVar1;
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional
                (&local_150);
    }
    else {
      if (pv._0_4_ != 0x2f) goto LAB_003c941a;
      Value::get_value<std::array<tinyusdz::value::half,4ul>>
                ((optional<std::array<tinyusdz::value::half,_4UL>_> *)&v_5,stack0xffffffffffffffe0,
                 false);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::
      optional<std::array<tinyusdz::value::half,_4UL>,_0>
                ((optional<std::array<tinyusdz::value::half,_4UL>_> *)local_192,
                 (optional<std::array<tinyusdz::value::half,_4UL>_> *)&v_5);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::~optional
                ((optional<std::array<tinyusdz::value::half,_4UL>_> *)&v_5);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_192);
      if (bVar1) {
        pvVar10 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::value
                            ((optional<std::array<tinyusdz::value::half,_4UL>_> *)local_192);
        local_1a4._M_elems = *&pvVar10->_M_elems;
        pvVar11 = ::std::array<tinyusdz::value::half,_4UL>::operator[](&local_1a4,0);
        fVar16 = half_to_float((half)pvVar11->value);
        pvVar15 = ::std::array<double,_4UL>::operator[]((array<double,_4UL> *)&pv_8.contained,0);
        *pvVar15 = (double)fVar16;
        pvVar11 = ::std::array<tinyusdz::value::half,_4UL>::operator[](&local_1a4,1);
        fVar16 = half_to_float((half)pvVar11->value);
        pvVar15 = ::std::array<double,_4UL>::operator[]((array<double,_4UL> *)&pv_8.contained,1);
        *pvVar15 = (double)fVar16;
        pvVar11 = ::std::array<tinyusdz::value::half,_4UL>::operator[](&local_1a4,2);
        fVar16 = half_to_float((half)pvVar11->value);
        pvVar15 = ::std::array<double,_4UL>::operator[]((array<double,_4UL> *)&pv_8.contained,2);
        *pvVar15 = (double)fVar16;
        pvVar11 = ::std::array<tinyusdz::value::half,_4UL>::operator[](&local_1a4,3);
        fVar16 = half_to_float((half)pvVar11->value);
        pvVar15 = ::std::array<double,_4UL>::operator[]((array<double,_4UL> *)&pv_8.contained,3);
        *pvVar15 = (double)fVar16;
        Value::operator=(stack0xffffffffffffffe0,(array<double,_4UL> *)&pv_8.contained);
        reqType_local._7_1_ = 1;
      }
      local_38 = (uint)bVar1;
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_4UL>_>::~optional
                ((optional<std::array<tinyusdz::value::half,_4UL>_> *)local_192);
    }
    if (local_38 != 0) goto LAB_003c941e;
  }
LAB_003c941a:
  reqType_local._7_1_ = 0;
LAB_003c941e:
  return (bool)(reqType_local._7_1_ & 1);
}

Assistant:

bool UpcastType(const std::string &reqType, value::Value &inout) {
  // `reqType` may be Role type. Get underlying type
  uint32_t tyid;
  if (auto pv = value::TryGetUnderlyingTypeId(reqType)) {
    tyid = pv.value();
  } else {
    // Invalid reqType.
    return false;
  }

  bool reqTypeArray = false;
  //uint32_t baseReqTyId;
  DCOUT("UpcastType trial: reqTy : " << reqType
                                     << ", valtype = " << inout.type_name());

  if (endsWith(reqType, "[]")) {
    reqTypeArray = true;
    //baseReqTyId = value::GetTypeId(removeSuffix(reqType, "[]"));
  } else {
    //baseReqTyId = value::GetTypeId(reqType);
  }
  DCOUT("is array: " << reqTypeArray);

  // For array
  if (reqTypeArray) {
    // TODO
  } else {
    if (tyid == value::TYPE_ID_FLOAT) {
      float dst;
      if (auto pv = inout.get_value<value::half>()) {
        dst = half_to_float(pv.value());
        inout = dst;
        return true;
      }
    } else if (tyid == value::TYPE_ID_FLOAT2) {
      if (auto pv = inout.get_value<value::half2>()) {
        value::float2 dst;
        value::half2 v = pv.value();
        dst[0] = half_to_float(v[0]);
        dst[1] = half_to_float(v[1]);
        inout = dst;
        return true;
      }

    } else if (tyid == value::TYPE_ID_FLOAT3) {
      value::float3 dst;
      if (auto pv = inout.get_value<value::half3>()) {
        value::half3 v = pv.value();
        dst[0] = half_to_float(v[0]);
        dst[1] = half_to_float(v[1]);
        dst[2] = half_to_float(v[2]);
        inout = dst;
        return true;
      }
    } else if (tyid == value::TYPE_ID_FLOAT4) {
      value::float4 dst;
      if (auto pv = inout.get_value<value::half4>()) {
        value::half4 v = pv.value();
        dst[0] = half_to_float(v[0]);
        dst[1] = half_to_float(v[1]);
        dst[2] = half_to_float(v[2]);
        dst[3] = half_to_float(v[3]);
        inout = dst;
        return true;
      }
    } else if (tyid == value::TYPE_ID_DOUBLE) {
      double dst;
      if (auto pv = inout.get_value<value::half>()) {
        dst = double(half_to_float(pv.value()));
        inout = dst;
        return true;
      }
    } else if (tyid == value::TYPE_ID_DOUBLE2) {
      value::double2 dst;
      if (auto pv = inout.get_value<value::half2>()) {
        value::half2 v = pv.value();
        dst[0] = double(half_to_float(v[0]));
        dst[1] = double(half_to_float(v[1]));
        inout = dst;
        return true;
      }
    } else if (tyid == value::TYPE_ID_DOUBLE3) {
      value::double3 dst;
      if (auto pv = inout.get_value<value::half3>()) {
        value::half3 v = pv.value();
        dst[0] = double(half_to_float(v[0]));
        dst[1] = double(half_to_float(v[1]));
        dst[2] = double(half_to_float(v[2]));
        inout = dst;
        return true;
      }
    } else if (tyid == value::TYPE_ID_DOUBLE4) {
      value::double4 dst;
      if (auto pv = inout.get_value<value::half4>()) {
        value::half4 v = pv.value();
        dst[0] = double(half_to_float(v[0]));
        dst[1] = double(half_to_float(v[1]));
        dst[2] = double(half_to_float(v[2]));
        dst[3] = double(half_to_float(v[3]));
        inout = dst;
        return true;
      }
    }
  }

  return false;
}